

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void key_press_proc(Am_Object *command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Input_Char c;
  Am_Object animator;
  Am_Object local_20 [8];
  Am_Object inter;
  Am_Input_Char local_10;
  Am_Input_Char local_c;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)command);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11b);
  Am_Input_Char::Am_Input_Char(&c,pAVar2);
  Am_Input_Char::Am_Input_Char(&local_c,"q",true);
  bVar1 = Am_Input_Char::operator==(&c,local_c);
  if (bVar1) {
    Am_Exit_Main_Event_Loop();
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_10,"a",true);
    bVar1 = Am_Input_Char::operator==(&c,local_10);
    if (bVar1) {
      Am_Object::Get_Owner(local_20,(Am_Slot_Flags)&inter);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_20,(ulong)ANIMATOR);
      Am_Object::Am_Object(&animator,pAVar2);
      Am_Object::~Am_Object(local_20);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)&animator,0xcc);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      Am_Object::Set((ushort)&animator,true,(ulong)!bVar1);
      Am_Object::~Am_Object(&animator);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Keyboard Commands:");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(poVar3,"  a - toggle animation");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(poVar3,"  q - quit");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q")
    Am_Exit_Main_Event_Loop();
  else if (c == "a") {
    Am_Object animator = inter.Get_Owner().Get(ANIMATOR);
    bool active = animator.Get(Am_ACTIVE);
    animator.Set(Am_ACTIVE, !active);
  } else
    cout << "Keyboard Commands:" << endl
         << "  a - toggle animation" << endl
         << "  q - quit" << endl;
}